

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::SetLogFilenameExtension(char *ext)

{
  LogDestination *this;
  LogSeverity local_1c;
  int severity;
  lock_guard<std::mutex> l;
  char *ext_local;
  
  l._M_device = (mutex_type *)ext;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe8,(mutex_type *)log_mutex);
  for (local_1c = GLOG_INFO; (int)local_1c < 4; local_1c = local_1c + GLOG_WARNING) {
    this = log_destination(local_1c);
    anon_unknown_8::LogFileObject::SetExtension(&this->fileobject_,(char *)l._M_device);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

inline void LogDestination::SetLogFilenameExtension(const char* ext) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  std::lock_guard<std::mutex> l{log_mutex};
  for (int severity = 0; severity < NUM_SEVERITIES; ++severity) {
    log_destination(static_cast<LogSeverity>(severity))
        ->fileobject_.SetExtension(ext);
  }
}